

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void icetMatrixFrustum(IceTDouble left,IceTDouble right,IceTDouble bottom,IceTDouble top,
                      IceTDouble znear,IceTDouble zfar,IceTDouble *mat_out)

{
  IceTDouble *mat_out_local;
  IceTDouble zfar_local;
  IceTDouble znear_local;
  IceTDouble top_local;
  IceTDouble bottom_local;
  IceTDouble right_local;
  IceTDouble left_local;
  
  *mat_out = (IceTDouble)(((double)znear * 2.0) / ((double)right - (double)left));
  mat_out[1] = 0.0;
  mat_out[2] = 0.0;
  mat_out[3] = 0.0;
  mat_out[4] = 0.0;
  mat_out[5] = (IceTDouble)(((double)znear * 2.0) / ((double)top - (double)bottom));
  mat_out[6] = 0.0;
  mat_out[7] = 0.0;
  mat_out[8] = (IceTDouble)(((double)right + (double)left) / ((double)right - (double)left));
  mat_out[9] = (IceTDouble)(((double)top + (double)bottom) / ((double)top - (double)bottom));
  mat_out[10] = (IceTDouble)(-((double)zfar + (double)znear) / ((double)zfar - (double)znear));
  mat_out[0xb] = -1.0;
  mat_out[0xc] = 0.0;
  mat_out[0xd] = 0.0;
  mat_out[0xe] = (IceTDouble)
                 (((double)zfar * -2.0 * (double)znear) / ((double)zfar - (double)znear));
  mat_out[0xf] = 0.0;
  return;
}

Assistant:

ICET_EXPORT void icetMatrixFrustum(IceTDouble left, IceTDouble right,
                                   IceTDouble bottom, IceTDouble top,
                                   IceTDouble znear, IceTDouble zfar,
                                   IceTDouble *mat_out)
{
    mat_out[ 0] = 2.0*znear/(right-left);
    mat_out[ 1] = 0.0;
    mat_out[ 2] = 0.0;
    mat_out[ 3] = 0.0;

    mat_out[ 4] = 0.0;
    mat_out[ 5] = 2.0*znear/(top-bottom);
    mat_out[ 6] = 0.0;
    mat_out[ 7] = 0.0;

    mat_out[ 8] = (right+left)/(right-left);
    mat_out[ 9] = (top+bottom)/(top-bottom);
    mat_out[10] = -(zfar+znear)/(zfar-znear);
    mat_out[11] = -1.0;

    mat_out[12] = 0.0;
    mat_out[13] = 0.0;
    mat_out[14] = -2.0*zfar*znear/(zfar-znear);
    mat_out[15] = 0.0;
}